

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UBool __thiscall icu_63::UnicodeSet::operator==(UnicodeSet *this,UnicodeSet *o)

{
  uint uVar1;
  UBool UVar2;
  ulong uVar3;
  
  uVar1 = this->len;
  if (uVar1 != o->len) {
    return '\0';
  }
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      if (this->list[uVar3] != o->list[uVar3]) {
        return '\0';
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  UVar2 = UVector::operator==(this->strings,o->strings);
  return UVar2 != '\0';
}

Assistant:

UBool UnicodeSet::operator==(const UnicodeSet& o) const {
    if (len != o.len) return FALSE;
    for (int32_t i = 0; i < len; ++i) {
        if (list[i] != o.list[i]) return FALSE;
    }
    if (*strings != *o.strings) return FALSE;
    return TRUE;
}